

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O2

void __thiscall QFbScreen::setDirty(QFbScreen *this,QRect *rect)

{
  long in_FS_OFFSET;
  QPoint local_38;
  QRect local_30;
  QRect local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (QRect)QRect::operator&(rect,(QRect *)(this + 0x50));
  local_38 = (QPoint)((ulong)(uint)-(int)*(ulong *)(this + 0x50) -
                     (*(ulong *)(this + 0x50) & 0xffffffff00000000));
  local_30 = QRect::translated(&local_20,&local_38);
  QRegion::operator+=((QRegion *)(this + 0x38),&local_30);
  scheduleUpdate(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbScreen::setDirty(const QRect &rect)
{
    const QRect intersection = rect.intersected(mGeometry);
    const QPoint screenOffset = mGeometry.topLeft();
    mRepaintRegion += intersection.translated(-screenOffset); // global to local translation
    scheduleUpdate();
}